

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  uint64_t local_60;
  uint64_t _a;
  uint64_t _b;
  uint64_t _g;
  uint64_t _r;
  int xx;
  int yy;
  ssize_t h_local;
  ssize_t w_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *source_local;
  Image *this_local;
  
  _xx = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (ssize_t)source;
  source_local = this;
  if (w < 0) {
    h_local = get_width(source);
  }
  if ((long)_xx < 0) {
    _xx = get_height((Image *)x_local);
  }
  clamp_blit_dimensions(this,(Image *)x_local,&y_local,&w_local,&h_local,(ssize_t *)&xx,&sx,&sy);
  for (_r._4_4_ = 0; (long)_r._4_4_ < (long)_xx; _r._4_4_ = _r._4_4_ + 1) {
    for (_r._0_4_ = 0; (int)_r < h_local; _r._0_4_ = (int)_r + 1) {
      read_pixel((Image *)x_local,sx + (int)_r,sy + _r._4_4_,&_g,&_b,&_a,&local_60);
      if (((r != _g) || (g != _b)) || (b != _a)) {
        write_pixel(this,y_local + (int)_r,w_local + _r._4_4_,_g,_b,_a,local_60);
      }
    }
  }
  return;
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
      if (r != _r || g != _g || b != _b) {
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}